

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O1

fy_node * fy_node_create_scalar_internal(fy_document *fyd,char *data,size_t size,uint flags)

{
  undefined1 *puVar1;
  uint uVar2;
  fy_node_style fVar3;
  fy_node *fyn;
  fy_input *fyi;
  char *data_00;
  fy_token *pfVar4;
  int line;
  char *fmt;
  fy_atom handle;
  fy_atom local_68;
  
  if (fyd == (fy_document *)0x0) {
    return (fy_node *)0x0;
  }
  if (size == 0xffffffffffffffff && data != (char *)0x0) {
    size = strlen(data);
  }
  fyn = fy_node_alloc(fyd,FYNT_SCALAR);
  if (fyn == (fy_node *)0x0) {
    fmt = "fy_node_alloc() failed";
    data_00 = (char *)0x0;
    line = 0x1257;
  }
  else {
    if ((flags & 4) == 0) {
      fyi = fy_input_from_data(data,size,&local_68,SUB41((flags & 2) >> 1,0));
      data_00 = (char *)0x0;
    }
    else {
      data_00 = (char *)malloc(size);
      if (data_00 == (char *)0x0) {
        fmt = "malloc() failed";
        data_00 = (char *)0x0;
        line = 0x125c;
        goto LAB_001235bf;
      }
      memcpy(data_00,data,size);
      fyi = fy_input_from_malloc_data(data_00,size,&local_68,SUB41((flags & 2) >> 1,0));
    }
    if (fyi == (fy_input *)0x0) {
      fmt = "fy_input_from_data() failed";
      line = 0x1264;
    }
    else {
      if ((flags & 1) == 0) {
        uVar2 = (uint)((local_68._52_1_ & 0x3f) != 0);
        pfVar4 = fy_token_create(FYTT_SCALAR,&local_68,(ulong)(uVar2 * 2));
        (fyn->field_12).scalar = pfVar4;
        fVar3 = uVar2 * 2 + FYNS_PLAIN;
      }
      else {
        pfVar4 = fy_token_create(FYTT_ALIAS,&local_68);
        (fyn->field_12).scalar = pfVar4;
        fVar3 = FYNS_ALIAS;
      }
      if ((fyn->field_12).scalar != (fy_token *)0x0) {
        fyn->style = fVar3;
        fy_input_unref(fyi);
        return fyn;
      }
      fmt = "fy_token_create() failed";
      data_00 = (char *)0x0;
      line = 0x126e;
    }
  }
LAB_001235bf:
  fy_document_diag(fyd,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                   ,line,"fy_node_create_scalar_internal",fmt);
  if (data_00 != (char *)0x0) {
    free(data_00);
  }
  fy_node_detach_and_free(fyn);
  puVar1 = &fyd->diag->field_0x3c;
  *puVar1 = *puVar1 & 0xfe;
  return (fy_node *)0x0;
}

Assistant:

static struct fy_node *
fy_node_create_scalar_internal(struct fy_document *fyd, const char *data, size_t size,
                               unsigned int flags) {
    const bool alias = !!(flags & FYNCSIF_ALIAS);
    const bool simple = !!(flags & FYNCSIF_SIMPLE);
    const bool copy = !!(flags & FYNCSIF_COPY);
    const bool malloced = !!(flags & FYNCSIF_MALLOCED);
    struct fy_node *fyn = NULL;
    struct fy_input *fyi;
    struct fy_atom handle;
    enum fy_scalar_style style;
    char *data_copy = NULL;

    if (!fyd)
        return NULL;

    if (data && size == (size_t) -1)
        size = strlen(data);

    fyn = fy_node_alloc(fyd, FYNT_SCALAR);
    fyd_error_check(fyd, fyn, err_out,
                    "fy_node_alloc() failed");

    if (copy) {
        data_copy = malloc(size);
        fyd_error_check(fyd, data_copy, err_out,
                        "malloc() failed");
        memcpy(data_copy, data, size);
        fyi = fy_input_from_malloc_data(data_copy, size, &handle, simple);
    } else if (malloced)
        fyi = fy_input_from_malloc_data((void *) data, size, &handle, simple);
    else
        fyi = fy_input_from_data(data, size, &handle, simple);
    fyd_error_check(fyd, fyi, err_out,
                    "fy_input_from_data() failed");
    data_copy = NULL;

    if (!alias) {
        style = handle.style == FYAS_PLAIN ? FYSS_PLAIN : FYSS_DOUBLE_QUOTED;
        fyn->scalar = fy_token_create(FYTT_SCALAR, &handle, style);
    } else
        fyn->scalar = fy_token_create(FYTT_ALIAS, &handle);

    fyd_error_check(fyd, fyn->scalar, err_out,
                    "fy_token_create() failed");

    fyn->style = !alias ? (style == FYSS_PLAIN ? FYNS_PLAIN : FYNS_DOUBLE_QUOTED) : FYNS_ALIAS;

    /* take away the input reference */
    fy_input_unref(fyi);

    return fyn;

    err_out:
    if (data_copy)
        free(data_copy);
    fy_node_detach_and_free(fyn);
    fyd->diag->on_error = false;
    return NULL;
}